

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

ER __thiscall
slang::ast::ForeachLoopStatement::evalRecursive
          (ForeachLoopStatement *this,EvalContext *context,ConstantValue *cv,
          span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> currDims)

{
  SVQueue *pSVar1;
  _Map_pointer ppCVar2;
  ConstantRange CVar3;
  bool bVar4;
  int iVar5;
  int32_t iVar6;
  ER EVar7;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar8;
  variant_alternative_t<7UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  _Base_ptr p_Var10;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar11;
  reference cv_00;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar12;
  void *pvVar13;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar14;
  int iVar15;
  pointer pLVar16;
  pointer extraout_RDX;
  pointer pCVar17;
  ER unaff_EBP;
  ER unaff_R13D;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar18;
  ER EVar19;
  _Rb_tree_header *p_Var20;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> sVar21;
  undefined1 local_f1;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f0;
  uint local_e8;
  undefined2 local_e4;
  EvalContext *local_e0;
  ForeachLoopStatement *local_d8;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> *local_d0;
  ConstantValue *local_c8;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_c0;
  undefined1 local_a0;
  ConstantValue *local_98;
  span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> local_90;
  void *local_80;
  pointer local_78;
  pointer local_70;
  undefined8 local_68;
  void *local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_90.size_ = currDims.size_;
  pLVar16 = currDims.data_;
  local_e0 = context;
  local_d8 = this;
  local_90.data_ = pLVar16;
  if (local_90.size_ != 0) {
    if (pLVar16->loopVar == (IteratorSymbol *)0x0) {
      local_a0 = 0;
      sVar21 = nonstd::span_lite::
               span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
               subspan(&local_90,1,0xffffffffffffffff);
      EVar7 = evalRecursive(local_d8,local_e0,(ConstantValue *)&local_c0,sVar21);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0);
      return EVar7;
    }
    local_58._M_index = '\0';
    local_98 = EvalContext::createLocal
                         (context,(ValueSymbol *)pLVar16->loopVar,(ConstantValue *)&local_58);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_58);
    switch(*(__index_type *)
            ((long)&(cv->value).
                    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            + 0x20)) {
    case '\x05':
      pvVar8 = std::
               get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         (&cv->value);
      pCVar17 = (pvVar8->
                super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
                _M_impl.super__Vector_impl_data._M_start;
      local_60 = (void *)(((long)(pvVar8->
                                 super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar17 >> 3) *
                         -0x3333333333333333);
      local_78 = pCVar17;
      break;
    case '\x06':
      if (local_90.size_ != 1) {
        assert::assertFailed
                  ("currDims.size() == 1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,0x76d,
                   "ER slang::ast::ForeachLoopStatement::evalRecursive(EvalContext &, const ConstantValue &, span<const LoopDim>) const"
                  );
      }
      pvVar12 = std::
                get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (&cv->value);
      if (pvVar12->_M_string_length != 0) {
        aVar18.val = 0;
        while( true ) {
          local_e8 = 0x20;
          local_e4 = 1;
          local_f0 = aVar18;
          SVInt::clearUnusedBits((SVInt *)&local_f0);
          local_c0._0_8_ = local_f0;
          local_c0._8_4_ = local_e8;
          local_c0._12_1_ = (undefined1)local_e4;
          local_c0._13_1_ = local_e4._1_1_;
          if (0x40 < local_e8 || (local_e4 & 0x100) != 0) {
            local_f0.val = 0;
          }
          local_a0 = 1;
          local_c8 = local_98;
          std::operator=(&local_c8,&local_c0,&local_f1);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_c0);
          if (((0x40 < local_e8) || ((local_e4 & 0x100) != 0)) &&
             ((void *)local_f0.val != (void *)0x0)) {
            operator_delete__(local_f0.pVal);
          }
          EVar7 = Statement::eval(local_d8->body,local_e0);
          if ((EVar7 == Continue) || (EVar19 = EVar7, EVar7 == Success)) {
            EVar19 = unaff_EBP;
          }
          if ((EVar7 != Continue) && (EVar7 != Success)) break;
          aVar18.pVal = (uint64_t *)(aVar18.val + 1);
          unaff_EBP = EVar19;
          if ((void *)pvVar12->_M_string_length <= (ulong)aVar18) {
            return Success;
          }
        }
        return EVar19;
      }
      return Success;
    case '\a':
      pvVar9 = std::
               get<7ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                         (&cv->value);
      p_Var10 = (pvVar9->ptr->
                super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var20 = &(pvVar9->ptr->
                 super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                 )._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 == p_Var20) {
        return Success;
      }
      while( true ) {
        local_c0._0_8_ = local_98;
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
          ::_S_vtable._M_arr[(long)(char)p_Var10[2]._M_color + 1]._M_data)
                  ((anon_class_8_1_8991fb9c *)&local_c0,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)(p_Var10 + 1));
        if (local_90.size_ < 2) {
          EVar7 = Statement::eval(local_d8->body,local_e0);
        }
        else {
          sVar21 = nonstd::span_lite::
                   span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                   subspan(&local_90,1,0xffffffffffffffff);
          EVar7 = evalRecursive(local_d8,local_e0,(ConstantValue *)&p_Var10[2]._M_parent,sVar21);
        }
        if ((EVar7 == Continue) || (EVar19 = EVar7, EVar7 == Success)) {
          EVar19 = unaff_R13D;
        }
        if ((EVar7 != Continue) && (EVar7 != Success)) break;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        unaff_R13D = EVar19;
        if ((_Rb_tree_header *)p_Var10 == p_Var20) {
          return Success;
        }
      }
      return EVar19;
    case '\b':
      pvVar11 = std::
                get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (&cv->value);
      pSVar1 = pvVar11->ptr;
      local_d0 = &(pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_start;
      aVar18.val = 0;
      while( true ) {
        ppCVar2 = (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        if ((void *)(((long)(pSVar1->
                            super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ).
                            super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)(pSVar1->
                            super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ).
                            super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
                     -0x3333333333333333 +
                    ((long)(pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                     (long)(pSVar1->
                           super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>)
                           .
                           super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                    -0x3333333333333333 +
                    (((long)ppCVar2 -
                      (long)(pSVar1->
                            super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ).
                            super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                    (ulong)(ppCVar2 == (_Map_pointer)0x0)) * 0xc) <= aVar18.val) {
          return Success;
        }
        local_e8 = 0x20;
        local_e4 = 1;
        local_f0 = aVar18;
        SVInt::clearUnusedBits((SVInt *)&local_f0);
        local_c0._0_8_ = local_f0;
        local_c0._8_4_ = local_e8;
        local_c0._12_1_ = (undefined1)local_e4;
        local_c0._13_1_ = local_e4._1_1_;
        if (0x40 < local_e8 || (local_e4 & 0x100) != 0) {
          local_f0.val = 0;
        }
        local_a0 = 1;
        local_c8 = local_98;
        std::operator=(&local_c8,&local_c0,&local_f1);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_c0);
        if (((0x40 < local_e8) || ((local_e4 & 0x100) != 0)) &&
           ((void *)local_f0.val != (void *)0x0)) {
          operator_delete__(local_f0.pVal);
        }
        if (local_90.size_ < 2) {
          EVar7 = Statement::eval(local_d8->body,local_e0);
        }
        else {
          cv_00 = std::
                  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                  ::operator[](local_d0,aVar18.val);
          sVar21 = nonstd::span_lite::
                   span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                   subspan(&local_90,1,0xffffffffffffffff);
          EVar7 = evalRecursive(local_d8,local_e0,cv_00,sVar21);
        }
        if ((EVar7 == Continue) || (EVar19 = EVar7, EVar7 == Success)) {
          EVar19 = unaff_R13D;
        }
        if ((EVar7 != Continue) && (EVar7 != Success)) break;
        aVar18.pVal = (uint64_t *)(aVar18.val + 1);
        unaff_R13D = EVar19;
      }
      return EVar19;
    default:
      local_78 = (pointer)0x0;
      local_60 = (void *)0x0;
      pCVar17 = extraout_RDX;
    }
    if ((pLVar16->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_engaged == false) {
      if ((int)local_60 < 1) {
        return Success;
      }
      pvVar13 = (void *)(ulong)((int)local_60 - 1);
      local_d0 = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                  *)0x1;
      aVar18.val = 0;
      local_68 = 0;
      local_80 = pvVar13;
    }
    else {
      CVar3 = (pLVar16->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value;
      pvVar13 = (void *)((ulong)CVar3 >> 0x20);
      iVar15 = CVar3.left;
      iVar5 = CVar3.right;
      local_68 = CONCAT71((int7)((ulong)pCVar17 >> 8),iVar5 <= iVar15);
      if (iVar15 < iVar5) {
        local_d0 = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                    *)0x1;
        if (iVar5 < iVar15) {
          return Success;
        }
      }
      else {
        local_d0 = (_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>
                    *)0xffffffffffffffff;
        if (iVar15 < iVar5) {
          return Success;
        }
      }
      aVar18 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar15;
      local_80 = (void *)((long)CVar3 << 0x20 | (ulong)pvVar13);
    }
    local_70 = pLVar16;
    do {
      local_e8 = 0x20;
      local_e4 = 1;
      local_f0 = aVar18;
      SVInt::clearUnusedBits((SVInt *)&local_f0);
      local_c0._0_8_ = local_f0;
      local_c0._8_4_ = local_e8;
      local_c0._12_1_ = (undefined1)local_e4;
      local_c0._13_1_ = local_e4._1_1_;
      if (0x40 < local_e8 || (local_e4 & 0x100) != 0) {
        local_f0.val = 0;
      }
      local_a0 = 1;
      local_c8 = local_98;
      std::operator=(&local_c8,&local_c0,&local_f1);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&local_c0);
      if (((0x40 < local_e8) || ((local_e4 & 0x100) != 0)) && ((void *)local_f0.val != (void *)0x0))
      {
        operator_delete__(local_f0.pVal);
      }
      if (local_90.size_ < 2) {
        EVar7 = Statement::eval(local_d8->body,local_e0);
      }
      else {
        aVar14 = aVar18;
        if ((local_70->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged == true) {
          local_c0._0_8_ = local_80;
          iVar6 = ConstantRange::translateIndex((ConstantRange *)&local_c0,(int32_t)aVar18.val);
          aVar14 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)(long)iVar6;
        }
        if (local_60 == (void *)0x0) {
          local_a0 = 0;
        }
        else {
          if (local_60 <= aVar14.val) break;
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_c0,
                            (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)(local_78 + aVar14.val));
        }
        sVar21 = nonstd::span_lite::
                 span<const_slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL>::
                 subspan(&local_90,1,0xffffffffffffffff);
        EVar7 = evalRecursive(local_d8,local_e0,(ConstantValue *)&local_c0,sVar21);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_c0);
      }
      if ((EVar7 == Continue) || (EVar19 = EVar7, EVar7 == Success)) {
        EVar19 = (ER)pLVar16;
      }
      if ((EVar7 != Continue) && (EVar7 != Success)) {
        return EVar19;
      }
      aVar18.val = aVar18.val + (long)local_d0;
      bVar4 = (long)aVar18.val <= (long)(int)pvVar13;
      if ((char)local_68 != '\0') {
        bVar4 = (long)(int)pvVar13 <= (long)aVar18.val;
      }
      pLVar16 = (pointer)(ulong)EVar19;
      if (!bVar4) {
        return Success;
      }
    } while( true );
  }
  std::terminate();
}

Assistant:

ER ForeachLoopStatement::evalRecursive(EvalContext& context, const ConstantValue& cv,
                                       span<const LoopDim> currDims) const {
    // If there is no loop var just skip this index.
    auto& dim = currDims[0];
    if (!dim.loopVar) {
        // Shouldn't ever be at the end here.
        return evalRecursive(context, nullptr, currDims.subspan(1));
    }

    auto local = context.createLocal(dim.loopVar);

    // If this is an associative array, looping happens over the keys.
    if (cv.isMap()) {
        auto& map = *cv.map();
        for (auto& [key, val] : map) {
            *local = key;

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, val, currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isQueue()) {
        auto& q = *cv.queue();
        for (size_t i = 0; i < q.size(); i++) {
            *local = SVInt(32, i, true);

            ER result;
            if (currDims.size() > 1)
                result = evalRecursive(context, q[i], currDims.subspan(1));
            else
                result = body.eval(context);

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else if (cv.isString()) {
        ASSERT(currDims.size() == 1);

        auto& str = cv.str();
        for (size_t i = 0; i < str.size(); i++) {
            *local = SVInt(32, i, true);

            ER result = body.eval(context);
            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }
    else {
        span<const ConstantValue> elements;
        if (cv.isUnpacked())
            elements = cv.elements();

        ConstantRange range;
        bool isLittleEndian;
        if (dim.range) {
            range = *dim.range;
            isLittleEndian = range.isLittleEndian();
        }
        else {
            range = {0, int32_t(elements.size()) - 1};
            isLittleEndian = false;
        }

        for (int32_t i = range.left; isLittleEndian ? i >= range.right : i <= range.right;
             isLittleEndian ? i-- : i++) {

            *local = SVInt(32, uint64_t(i), true);

            ER result;
            if (currDims.size() > 1) {
                size_t index = size_t(i);
                if (dim.range)
                    index = (size_t)range.reverse().translateIndex(i);

                result = evalRecursive(context, elements.empty() ? nullptr : elements[index],
                                       currDims.subspan(1));
            }
            else {
                result = body.eval(context);
            }

            if (result != ER::Success && result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}